

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall CoreML::Model::toStringStream(Model *this,stringstream *ss)

{
  bool bVar1;
  int32_t iVar2;
  MLModelType x;
  ostream *poVar3;
  element_type *peVar4;
  char *pcVar5;
  ModelDescription *pMVar6;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar7;
  reference pFVar8;
  string *psVar9;
  FeatureDescription *output;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_1;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  stringstream *ss_local;
  Model *this_local;
  
  poVar3 = std::operator<<((ostream *)(ss + 0x10),"Spec version: ");
  peVar4 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_spec);
  iVar2 = Specification::Model::specificationversion(peVar4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)(ss + 0x10),"Model type: ");
  peVar4 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_spec);
  x = Specification::Model::Type_case(peVar4);
  pcVar5 = MLModelType_Name(x);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)(ss + 0x10),"Interface:");
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)(ss + 0x10),"\t");
  poVar3 = std::operator<<(poVar3,"Inputs:");
  std::operator<<(poVar3,"\n");
  peVar4 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_spec);
  pMVar6 = Specification::Model::description(peVar4);
  pRVar7 = Specification::ModelDescription::input(pMVar6);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar7);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar7)
  ;
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&input), bVar1) {
    pFVar8 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1);
    writeFeatureDescription(ss,pFVar8);
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  poVar3 = std::operator<<((ostream *)(ss + 0x10),"\t");
  poVar3 = std::operator<<(poVar3,"Outputs:");
  std::operator<<(poVar3,"\n");
  peVar4 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_spec);
  pMVar6 = Specification::Model::description(peVar4);
  pRVar7 = Specification::ModelDescription::output(pMVar6);
  __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar7);
  output = (FeatureDescription *)
           google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                     (pRVar7);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1_1,(iterator *)&output), bVar1) {
    pFVar8 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end1_1);
    writeFeatureDescription(ss,pFVar8);
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1_1);
  }
  peVar4 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_spec);
  pMVar6 = Specification::Model::description(peVar4);
  psVar9 = Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMVar6);
  bVar1 = std::operator!=(psVar9,"");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)(ss + 0x10),"\t");
    poVar3 = std::operator<<(poVar3,"Predicted feature name: ");
    peVar4 = std::
             __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_spec);
    pMVar6 = Specification::Model::description(peVar4);
    psVar9 = Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMVar6);
    poVar3 = std::operator<<(poVar3,(string *)psVar9);
    std::operator<<(poVar3,"\n");
  }
  peVar4 = std::
           __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_spec);
  pMVar6 = Specification::Model::description(peVar4);
  psVar9 = Specification::ModelDescription::predictedprobabilitiesname_abi_cxx11_(pMVar6);
  bVar1 = std::operator!=(psVar9,"");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)(ss + 0x10),"\t");
    poVar3 = std::operator<<(poVar3,"Predicted probability name: ");
    peVar4 = std::
             __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_spec);
    pMVar6 = Specification::Model::description(peVar4);
    psVar9 = Specification::ModelDescription::predictedprobabilitiesname_abi_cxx11_(pMVar6);
    poVar3 = std::operator<<(poVar3,(string *)psVar9);
    std::operator<<(poVar3,"\n");
  }
  return;
}

Assistant:

void Model::toStringStream(std::stringstream& ss) const {
        ss << "Spec version: " << m_spec->specificationversion() << "\n";
        ss << "Model type: " << MLModelType_Name(static_cast<MLModelType>(m_spec->Type_case())) << "\n";
        ss << "Interface:" << "\n";
        ss << "\t" << "Inputs:" << "\n";
        for (const auto& input : m_spec->description().input()) {
            writeFeatureDescription(ss, input);
        }
        ss << "\t" << "Outputs:" << "\n";
        for (const auto& output : m_spec->description().output()) {
            writeFeatureDescription(ss, output);
        }
        if (m_spec->description().predictedfeaturename() != "") {
            ss << "\t" << "Predicted feature name: " << m_spec->description().predictedfeaturename() << "\n";
        }
        if (m_spec->description().predictedprobabilitiesname() != "") {
            ss << "\t" << "Predicted probability name: " << m_spec->description().predictedprobabilitiesname() << "\n";
        }
    }